

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  long in_RSI;
  int *in_RDI;
  int j;
  char *arg;
  String arg_string;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  String *this;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int local_40;
  char **in_stack_ffffffffffffffc8;
  String *in_stack_ffffffffffffffd0;
  Int32 *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  local_40 = 1;
  do {
    if (*in_RDI <= local_40) {
      if ((g_help_flag & 1) != 0) {
        PrintColorEncoded((char *)in_stack_ffffffffffffffd0);
      }
      return;
    }
    this = (String *)&stack0xffffffffffffffd8;
    StreamableToString<char*>(in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (String *)String::c_str(this);
    in_stack_ffffffffffffffbf =
         ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       (char *)this,
                       (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                      );
    iVar2 = local_40;
    if ((((((((bool)in_stack_ffffffffffffffbf) ||
            (in_stack_ffffffffffffffaf =
                  ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8
                                                ),(char *)this,
                                (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))))),
            iVar2 = local_40, (bool)in_stack_ffffffffffffffaf)) ||
           (in_stack_ffffffffffffffae =
                 ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                               ,(char *)this,
                               (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                                CONCAT16(in_stack_ffffffffffffffae,
                                                         CONCAT15(in_stack_ffffffffffffffad,
                                                                  CONCAT14(in_stack_ffffffffffffffac
                                                                           ,CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                              ), iVar2 = local_40, (bool)in_stack_ffffffffffffffae)) ||
          (((in_stack_ffffffffffffffad =
                  ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                   CONCAT16(in_stack_ffffffffffffffae,
                                                            CONCAT15(in_stack_ffffffffffffffad,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                  (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                   CONCAT16(in_stack_ffffffffffffffa6,
                                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                  (String *)
                                  CONCAT17(in_stack_ffffffffffffff9f,
                                           CONCAT16(in_stack_ffffffffffffff9e,
                                                    CONCAT15(in_stack_ffffffffffffff9d,
                                                             CONCAT14(in_stack_ffffffffffffff9c,
                                                                      in_stack_ffffffffffffff98)))))
            , iVar2 = local_40, (bool)in_stack_ffffffffffffffad ||
            (in_stack_ffffffffffffffac =
                  ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                   CONCAT16(in_stack_ffffffffffffffae,
                                                            CONCAT15(in_stack_ffffffffffffffad,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                  (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                   CONCAT16(in_stack_ffffffffffffffa6,
                                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                  (String *)
                                  CONCAT17(in_stack_ffffffffffffff9f,
                                           CONCAT16(in_stack_ffffffffffffff9e,
                                                    CONCAT15(in_stack_ffffffffffffff9d,
                                                             CONCAT14(in_stack_ffffffffffffff9c,
                                                                      in_stack_ffffffffffffff98)))))
            , iVar2 = local_40, (bool)in_stack_ffffffffffffffac)) ||
           ((in_stack_ffffffffffffffab =
                  ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8
                                                ),(char *)this,
                                (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))))),
            iVar2 = local_40, (bool)in_stack_ffffffffffffffab ||
            ((in_stack_ffffffffffffffaa =
                   ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                    CONCAT16(in_stack_ffffffffffffffae,
                                                             CONCAT15(in_stack_ffffffffffffffad,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    CONCAT16(in_stack_ffffffffffffffa6,
                                                             CONCAT15(in_stack_ffffffffffffffa5,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                   (String *)
                                   CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT15(in_stack_ffffffffffffff9d,
                                                              CONCAT14(in_stack_ffffffffffffff9c,
                                                                       in_stack_ffffffffffffff98))))
                                  ), iVar2 = local_40, (bool)in_stack_ffffffffffffffaa ||
             (in_stack_ffffffffffffffa9 =
                   ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                    CONCAT16(in_stack_ffffffffffffffae,
                                                             CONCAT15(in_stack_ffffffffffffffad,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    CONCAT16(in_stack_ffffffffffffffa6,
                                                             CONCAT15(in_stack_ffffffffffffffa5,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                   (String *)
                                   CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT15(in_stack_ffffffffffffff9d,
                                                              CONCAT14(in_stack_ffffffffffffff9c,
                                                                       in_stack_ffffffffffffff98))))
                                  ), iVar2 = local_40, (bool)in_stack_ffffffffffffffa9)))))))) ||
         (in_stack_ffffffffffffffa8 =
               ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                             (char *)this,
                             (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                              CONCAT16(in_stack_ffffffffffffffae,
                                                       CONCAT15(in_stack_ffffffffffffffad,
                                                                CONCAT14(in_stack_ffffffffffffffac,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                            ), iVar2 = local_40, (bool)in_stack_ffffffffffffffa8)) ||
        (((in_stack_ffffffffffffffa7 =
                ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                 CONCAT16(in_stack_ffffffffffffffa6,
                                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                (String *)
                                CONCAT17(in_stack_ffffffffffffff9f,
                                         CONCAT16(in_stack_ffffffffffffff9e,
                                                  CONCAT15(in_stack_ffffffffffffff9d,
                                                           CONCAT14(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98))))),
          iVar2 = local_40, (bool)in_stack_ffffffffffffffa7 ||
          (in_stack_ffffffffffffffa6 =
                ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                              (char *)this,
                              (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                             ), iVar2 = local_40, (bool)in_stack_ffffffffffffffa6)) ||
         (in_stack_ffffffffffffffa5 =
               ParseInt32Flag((char *)CONCAT44(local_40,in_stack_ffffffffffffffe8),
                              in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), iVar2 = local_40
         , (bool)in_stack_ffffffffffffffa5)))) ||
       (((in_stack_ffffffffffffffa4 =
               ParseInt32Flag((char *)CONCAT44(local_40,in_stack_ffffffffffffffe8),
                              in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), iVar2 = local_40
         , (bool)in_stack_ffffffffffffffa4 ||
         (in_stack_ffffffffffffffa3 =
               ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                             (char *)this,
                             (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                              CONCAT16(in_stack_ffffffffffffffae,
                                                       CONCAT15(in_stack_ffffffffffffffad,
                                                                CONCAT14(in_stack_ffffffffffffffac,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                            ), iVar2 = local_40, (bool)in_stack_ffffffffffffffa3)) ||
        ((in_stack_ffffffffffffffa2 =
               ParseInt32Flag((char *)CONCAT44(local_40,in_stack_ffffffffffffffe8),
                              in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), iVar2 = local_40
         , (bool)in_stack_ffffffffffffffa2 ||
         ((in_stack_ffffffffffffffa1 =
                ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                                (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                 CONCAT16(in_stack_ffffffffffffffa6,
                                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                (String *)
                                CONCAT17(in_stack_ffffffffffffff9f,
                                         CONCAT16(in_stack_ffffffffffffff9e,
                                                  CONCAT15(in_stack_ffffffffffffff9d,
                                                           CONCAT14(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98))))),
          iVar2 = local_40, (bool)in_stack_ffffffffffffffa1 ||
          (in_stack_ffffffffffffffa0 =
                ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                              (char *)this,
                              (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                             ), iVar2 = local_40, (bool)in_stack_ffffffffffffffa0)))))))) {
      for (; local_40 != *in_RDI; local_40 = local_40 + 1) {
        *(undefined8 *)(in_RSI + (long)local_40 * 8) =
             *(undefined8 *)(in_RSI + (long)(local_40 + 1) * 8);
      }
      *in_RDI = *in_RDI + -1;
      local_40 = iVar2 + -1;
    }
    else {
      in_stack_ffffffffffffff9f =
           String::operator==(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      if ((((!(bool)in_stack_ffffffffffffff9f) &&
           (in_stack_ffffffffffffff9e =
                 String::operator==(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8),
           !(bool)in_stack_ffffffffffffff9e)) &&
          (in_stack_ffffffffffffff9d =
                String::operator==(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8),
          !(bool)in_stack_ffffffffffffff9d)) &&
         (in_stack_ffffffffffffff9c =
               String::operator==(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8),
         !(bool)in_stack_ffffffffffffff9c)) {
        bVar1 = HasGoogleTestFlagPrefix
                          ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                            CONCAT16(in_stack_ffffffffffffffa6,
                                                     CONCAT15(in_stack_ffffffffffffffa5,
                                                              CONCAT14(in_stack_ffffffffffffffa4,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                          );
        in_stack_ffffffffffffff98 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff98);
        if (!bVar1) goto LAB_002025b2;
      }
      g_help_flag = 1;
    }
LAB_002025b2:
    String::~String((String *)
                    CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        CONCAT13(in_stack_ffffffffffffffa3,
                                                                 CONCAT12(in_stack_ffffffffffffffa2,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))));
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const String arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}